

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::UberMaterial::writeTo(UberMaterial *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  BinaryWriter *in_stack_fffffffffffffe28;
  BinaryWriter *in_stack_fffffffffffffe30;
  SP *in_stack_fffffffffffffe60;
  BinaryWriter *entity;
  BinaryWriter *in_stack_fffffffffffffe68;
  BinaryWriter *this_00;
  BinaryWriter local_c0;
  int32_t local_38;
  int32_t local_14;
  BinaryWriter *local_10;
  
  local_10 = in_RSI;
  Material::writeTo((Material *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_fffffffffffffe30,(vec3f *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  local_14 = BinaryWriter::serialize(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x22747e);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_fffffffffffffe30,(vec3f *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  local_38 = BinaryWriter::serialize(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x227518);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_fffffffffffffe30,(vec3f *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  local_c0.emittedEntity._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       BinaryWriter::serialize(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x2275b5);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_fffffffffffffe30,(vec3f *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  local_c0.emittedEntity._M_t._M_impl._4_4_ =
       BinaryWriter::serialize(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x227655);
  BinaryWriter::write<pbrt::math::vec3f>
            (in_stack_fffffffffffffe30,(vec3f *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  local_c0.serializedEntity.c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_ =
       BinaryWriter::serialize(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x2276e0);
  BinaryWriter::write<float>(in_stack_fffffffffffffe30,(float *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  local_c0.serializedEntity.c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node._4_4_ =
       BinaryWriter::serialize(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x22776b);
  BinaryWriter::write<float>(in_stack_fffffffffffffe30,(float *)in_stack_fffffffffffffe28);
  this_00 = &local_c0;
  entity = local_10;
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  local_c0.serializedEntity.c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ =
       BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x2277f6);
  BinaryWriter::write<float>(in_stack_fffffffffffffe30,(float *)in_stack_fffffffffffffe28);
  BinaryWriter::write<float>(in_stack_fffffffffffffe30,(float *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_fffffffffffffe30,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x22789d);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)local_10,
             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe28);
  BinaryWriter::serialize(this_00,(SP *)entity);
  BinaryWriter::write<int>(local_10,(int *)in_stack_fffffffffffffe28);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x22790c);
  return 0xc;
}

Assistant:

int UberMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(kd);
    binary.write(binary.serialize(map_kd));
    binary.write(ks);
    binary.write(binary.serialize(map_ks));
    binary.write(kr);
    binary.write(binary.serialize(map_kr));
    binary.write(kt);
    binary.write(binary.serialize(map_kt));
    binary.write(opacity);
    binary.write(binary.serialize(map_opacity));
    binary.write(alpha);
    binary.write(binary.serialize(map_alpha));
    binary.write(shadowAlpha);
    binary.write(binary.serialize(map_shadowAlpha));
    binary.write(index);
    binary.write(roughness);
    binary.write(binary.serialize(map_roughness));
    binary.write(binary.serialize(map_bump));
    return TYPE_UBER_MATERIAL;
  }